

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

void __thiscall asmjit::BaseCompiler::BaseCompiler(BaseCompiler *this)

{
  BaseBuilder::BaseBuilder(&this->super_BaseBuilder);
  (this->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter =
       (_func_int **)&PTR__BaseCompiler_001594f0;
  this->_func = (FuncNode *)0x0;
  Zone::_init(&this->_vRegZone,0xfc8,1,(Temporary *)0x0);
  this->_localConstPool = (ConstPoolNode *)0x0;
  this->_globalConstPool = (ConstPoolNode *)0x0;
  (this->_jumpAnnotations).super_ZoneVectorBase._data = (void *)0x0;
  (this->_jumpAnnotations).super_ZoneVectorBase._size = 0;
  (this->_jumpAnnotations).super_ZoneVectorBase._capacity = 0;
  (this->_vRegArray).super_ZoneVectorBase._data = (void *)0x0;
  (this->_vRegArray).super_ZoneVectorBase._size = 0;
  (this->_vRegArray).super_ZoneVectorBase._capacity = 0;
  (this->super_BaseBuilder).super_BaseEmitter._emitterType = '\x03';
  (this->super_BaseBuilder).super_BaseEmitter._validationFlags = '\x01';
  return;
}

Assistant:

BaseCompiler::BaseCompiler() noexcept
  : BaseBuilder(),
    _func(nullptr),
    _vRegZone(4096 - Zone::kBlockOverhead),
    _vRegArray(),
    _localConstPool(nullptr),
    _globalConstPool(nullptr) {

  _emitterType = uint8_t(kTypeCompiler);
  _validationFlags = uint8_t(InstAPI::kValidationFlagVirtRegs);
}